

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeleteView.h
# Opt level: O1

void __thiscall DeleteView<BaseUser>::display(DeleteView<BaseUser> *this)

{
  BaseUser *pBVar1;
  
  pBVar1 = SingleObjectMixin<BaseUser>::getObject
                     (&this->super_SingleObjectMixin<BaseUser>,
                      (this->super_View).context.requestObjectId);
  if (pBVar1 != (BaseUser *)0x0) {
    (*(pBVar1->super_Model<BaseUser>)._vptr_Model[1])(pBVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Successfully deleted.\n",0x16);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not found.\n",0xb);
  return;
}

Assistant:

void DeleteView<T>::display() {
    T *object = SingleObjectMixin<T>::getObject(context.requestObjectId);
    if (object) {
        object->remove();
        cout << "Successfully deleted.\n";
    } else cout << "Not found.\n";
}